

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_emu.c
# Opt level: O1

gbstatus_e gb_emu_change_rom(gb_emu_t *gb_emu,char *rom_file_path)

{
  gbstatus_e gVar1;
  
  if (gb_emu == (gb_emu_t *)0x0) {
    __assert_fail("gb_emu != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/gb_emu.c"
                  ,0x41,"gbstatus_e gb_emu_change_rom(gb_emu_t *, const char *)");
  }
  if (rom_file_path != (char *)0x0) {
    if (gb_emu->cart_inserted == true) {
      cart_deinit(&gb_emu->cart);
    }
    gVar1 = cart_init(&gb_emu->cart,rom_file_path);
    if (gVar1 == GBSTATUS_OK) {
      mmu_switch_cart(&(gb_emu->gb).mmu,&gb_emu->cart);
      gb_emu_reset(gb_emu);
      gb_emu->cart_inserted = true;
      gVar1 = GBSTATUS_OK;
    }
    return gVar1;
  }
  __assert_fail("rom_file_path != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/gb_emu.c"
                ,0x42,"gbstatus_e gb_emu_change_rom(gb_emu_t *, const char *)");
}

Assistant:

gbstatus_e gb_emu_change_rom(gb_emu_t *gb_emu, const char *rom_file_path)
{
    assert(gb_emu != NULL);
    assert(rom_file_path != NULL);

    if (gb_emu->cart_inserted)
        cart_deinit(&gb_emu->cart);

    GBCHK(cart_init(&gb_emu->cart, rom_file_path));
    mmu_switch_cart(&gb_emu->gb.mmu, &gb_emu->cart);
    gb_emu_reset(gb_emu);

    gb_emu->cart_inserted = true;
    return GBSTATUS_OK;
}